

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cali.cpp
# Opt level: O2

int cali_channel_is_active(cali_id_t chn_id)

{
  bool bVar1;
  ostream *poVar2;
  uint uVar3;
  Channel channel;
  undefined1 local_230 [528];
  undefined4 local_20;
  
  cali::Caliper::instance();
  cali::Caliper::get_channel((Caliper *)local_230,(cali_id_t)(local_230 + 0x10));
  if (((GlobalData *)local_230._8_8_ == (GlobalData *)0x0) ||
     (*(_Atomic_word *)(local_230._8_8_ + 8) < 1)) {
    std::ofstream::ofstream(local_230 + 0x10);
    local_20 = 0;
    poVar2 = cali::Log::stream((Log *)(local_230 + 0x10));
    poVar2 = std::operator<<(poVar2,"cali_channel_is_active(): invalid channel id ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::ofstream::~ofstream(local_230 + 0x10);
    uVar3 = 0;
  }
  else {
    bVar1 = cali::Channel::is_active((Channel *)local_230);
    uVar3 = (uint)bVar1;
  }
  cali::Channel::~Channel((Channel *)local_230);
  return uVar3;
}

Assistant:

int cali_channel_is_active(cali_id_t chn_id)
{
    Channel channel = Caliper::instance().get_channel(chn_id);

    if (!channel) {
        Log(0).stream() << "cali_channel_is_active(): invalid channel id " << chn_id << std::endl;
        return 0;
    }

    return (channel.is_active() ? 1 : 0);
}